

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::TlsTest::readFromClient(TlsTest *this,AsyncIoStream *server)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  PromiseArena *pPVar3;
  _func_int **pp_Var4;
  PromiseArena *pPVar5;
  PromiseBase PVar6;
  void *pvVar7;
  TransformPromiseNodeBase *this_00;
  Promise<void> readPromise;
  Array<unsigned_char> buf;
  AsyncInputStream local_60;
  PromiseArena *local_58;
  _func_int **pp_Stack_50;
  PromiseArena *local_48;
  PromiseBase local_38;
  
  local_58 = (PromiseArena *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,4,4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pp_Stack_50 = (_func_int **)0x4;
  local_48 = (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
  AsyncInputStream::read(&local_60,(int)server,local_58,4);
  pPVar5 = local_48;
  pp_Var4 = pp_Stack_50;
  pPVar3 = local_58;
  AVar2._vptr_AsyncInputStream = local_60._vptr_AsyncInputStream;
  local_58 = (PromiseArena *)0x0;
  pp_Stack_50 = (_func_int **)0x0;
  pPVar1 = (PromiseArena *)local_60._vptr_AsyncInputStream[1];
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_60._vptr_AsyncInputStream - (long)pPVar1) < 0x38) {
    pvVar7 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3c8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_60,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:443:24)>
               ::anon_class_24_1_ba1d39d3_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3c8) = &PTR_destroy_0063d3d0;
    *(PromiseArena **)((long)pvVar7 + 1000) = pPVar3;
    *(_func_int ***)((long)pvVar7 + 0x3f0) = pp_Var4;
    *(PromiseArena **)((long)pvVar7 + 0x3f8) = pPVar5;
    *(void **)((long)pvVar7 + 0x3d0) = pvVar7;
  }
  else {
    local_60._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_60._vptr_AsyncInputStream + -7);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_60,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:443:24)>
               ::anon_class_24_1_ba1d39d3_for_func::operator());
    AVar2._vptr_AsyncInputStream[-7] = (_func_int *)&PTR_destroy_0063d3d0;
    AVar2._vptr_AsyncInputStream[-3] = (_func_int *)pPVar3;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember = pp_Var4;
    AVar2._vptr_AsyncInputStream[-1] = (_func_int *)pPVar5;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  PVar6.node.ptr = local_38.node.ptr;
  AVar2._vptr_AsyncInputStream = local_60._vptr_AsyncInputStream;
  *(TransformPromiseNodeBase **)local_38.node.ptr = this_00;
  if ((PromiseArenaMember *)local_60._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
    local_60._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  pp_Var4 = pp_Stack_50;
  pPVar1 = local_58;
  if (local_58 != (PromiseArena *)0x0) {
    local_58 = (PromiseArena *)0x0;
    pp_Stack_50 = (_func_int **)0x0;
    (*(code *)**(undefined8 **)local_48->bytes)(local_48,pPVar1,1,pp_Var4,pp_Var4,0);
  }
  return (Promise<void>)(PromiseNode *)PVar6.node.ptr;
}

Assistant:

Promise<void> readFromClient(AsyncIoStream& server) {
    auto buf = heapArray<byte>(4);

    auto readPromise = server.read(buf);

    auto checkBuffer = [buf = kj::mv(buf)]() {
      KJ_ASSERT(buf == "foo\x00"_kjb);
    };

    return readPromise.then(kj::mv(checkBuffer));
  }